

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O3

char ** new_attrib(char **in)

{
  char **ppcVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar6;
  int iVar5;
  
  uVar6 = 0xffffffff;
  do {
    iVar5 = (int)uVar6;
    uVar4 = iVar5 + 1;
    uVar6 = (ulong)uVar4;
  } while (in[uVar6] != (char *)0x0);
  ppcVar1 = (char **)__ckd_calloc__((ulong)(iVar5 + 2),8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                                    ,0xd0);
  if (uVar4 == 0) {
    uVar6 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pcVar2 = strdup(in[uVar3]);
      ppcVar1[uVar3] = pcVar2;
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  ppcVar1[uVar6] = (char *)0x0;
  return ppcVar1;
}

Assistant:

char **new_attrib(const char **in)
{
    char **out;
    uint32 len, i;

    for (len = 0; in[len]; len++);

    out = (char **)ckd_calloc(len+1, sizeof(char *));

    for (i = 0; i < len; i++) {
	out[i] = strdup(in[i]);
    }

    out[i] = NULL;

    return out;
}